

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O2

void __thiscall cmDebugger::cmDebuggerVariables::~cmDebuggerVariables(cmDebuggerVariables *this)

{
  ~cmDebuggerVariables(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

cmDebuggerVariables::~cmDebuggerVariables()
{
  ClearSubVariables();
  VariablesManager->UnregisterHandler(Id);
}